

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O2

unsigned_long
beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  bool bVar1;
  undefined8 *puVar2;
  unsigned_long out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)in);
  bVar1 = lexicalCastChecked<unsigned_long,std::__cxx11::string>(&out,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (bVar1) {
    return out;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_002f9568;
  __cxa_throw(puVar2,&BadLexicalCast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}